

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O2

void __thiscall soplex::SSVectorBase<double>::clear(SSVectorBase<double> *this)

{
  uint uVar1;
  int *piVar2;
  pointer pdVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (this->setupStatus == true) {
    uVar1 = (this->super_IdxSet).num;
    piVar2 = (this->super_IdxSet).idx;
    pdVar3 = (this->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    uVar5 = 0;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar5;
    }
    for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      pdVar3[piVar2[uVar5]] = 0.0;
    }
  }
  else {
    VectorBase<double>::clear(&this->super_VectorBase<double>);
  }
  (this->super_IdxSet).num = 0;
  this->setupStatus = true;
  return;
}

Assistant:

void clear()
   {
      if(isSetup())
      {
         for(int i = 0; i < num; ++i)
            VectorBase<R>::val[idx[i]] = 0;
      }
      else
         VectorBase<R>::clear();

      IdxSet::clear();
      setupStatus = true;

      assert(isConsistent());
   }